

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnginput.cc
# Opt level: O0

void __thiscall
PngInput::readImage(PngInput *this,void *bufferOut,size_t bufferOutByteCount,uint32_t param_4,
                   uint32_t param_5,FormatDescriptor *format)

{
  format_args args;
  format_args args_00;
  format_args args_01;
  long lVar1;
  bool bVar2;
  LodePNGColorType LVar3;
  uint uVar4;
  uint32_t uVar5;
  ImageSpec *pIVar6;
  uint *puVar7;
  runtime_error *prVar8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int> *pfVar9;
  const_reference pvVar10;
  size_t sVar11;
  undefined1 *puVar12;
  undefined2 *puVar13;
  v10 *in_RDX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  extraout_RDX;
  long in_RSI;
  v10 *pvVar14;
  long in_RDI;
  FormatDescriptor *in_R9;
  uint16_t *value_1;
  uint8_t *value;
  uint index;
  uint32_t c;
  uint32_t x;
  uint32_t y;
  array<unsigned_int,_4UL> sBits;
  size_t i;
  uchar *data;
  uint lodepngError;
  bool targetF;
  bool targetS;
  bool targetE;
  bool targetL;
  uint requestBits;
  uint32_t targetBitLength;
  uint32_t width;
  uint32_t height;
  uint32_t channelCount;
  FormatDescriptor *targetFormat;
  char **in_stack_fffffffffffffb28;
  size_type __n;
  array<unsigned_int,_4UL> *in_stack_fffffffffffffb30;
  void *in_stack_fffffffffffffb48;
  LodePNGState *in_stack_fffffffffffffb50;
  undefined8 in_stack_fffffffffffffb58;
  FormatDescriptor *in_stack_fffffffffffffb60;
  uchar *in_stack_fffffffffffffb68;
  size_t *psVar15;
  size_t in_stack_fffffffffffffb80;
  anon_class_8_1_e9de82e6 *in_stack_fffffffffffffba0;
  FormatDescriptor *local_448;
  uint local_424;
  uint local_420;
  uint local_41c;
  v10 *local_408;
  undefined1 local_3f0 [8];
  char *local_3e8;
  size_t local_3e0;
  string local_3d8 [36];
  uint local_3b4;
  FormatDescriptor *local_3b0;
  undefined1 local_3a1;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  size_t local_378;
  string local_370 [39];
  byte local_349;
  byte local_348;
  byte local_347;
  byte local_346;
  undefined1 local_345;
  char *local_338 [2];
  string local_328 [36];
  undefined4 local_304;
  uint local_300;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  local_2fc;
  uint32_t local_2ec;
  FormatDescriptor *local_2e8;
  FormatDescriptor *local_2e0;
  v10 *local_2d0;
  long local_2c8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  *local_2b8 [2];
  undefined8 local_2a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_2a0;
  char *local_298;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  *local_288;
  char *local_280;
  size_t sStack_278;
  string *local_270;
  unsigned_long_long in_stack_fffffffffffffd98;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_stack_fffffffffffffda0;
  undefined8 uVar16;
  string_view in_stack_fffffffffffffda8;
  char *local_230;
  size_t sStack_228;
  string *local_220;
  char *local_218;
  char **local_210;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
  local_208;
  undefined8 local_1b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
  *local_1a8;
  char *local_1a0;
  char **local_190;
  char **local_188;
  char **local_180;
  char **local_178;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  *local_170;
  char *local_168;
  size_t sStack_160;
  string *local_158;
  char *local_150;
  char **local_148;
  char *local_140;
  char **local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  undefined8 local_110;
  undefined1 *local_108;
  char *local_100;
  char **local_f8;
  char *local_f0;
  char **local_e8;
  char *local_e0;
  char **local_d8;
  char **local_d0;
  char *local_c8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_b0;
  undefined8 *local_a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_98;
  undefined8 local_90;
  undefined8 *local_88;
  char **local_80;
  char *local_78;
  size_t sStack_70;
  char *local_68;
  char **local_60;
  char *local_58;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
  *local_40;
  undefined8 *local_38;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
  *local_30;
  undefined8 local_28;
  undefined8 *local_20;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
  *local_18;
  char *local_10;
  char *local_8;
  
  local_2e0 = in_R9;
  local_2d0 = in_RDX;
  local_2c8 = in_RSI;
  bVar2 = FormatDescriptor::isUnknown((FormatDescriptor *)0x337603);
  if (bVar2) {
    pIVar6 = ImageInput::spec((ImageInput *)0x337616);
    local_448 = ImageSpec::format(pIVar6);
  }
  else {
    local_448 = local_2e0;
  }
  local_2e8 = local_448;
  local_2ec = FormatDescriptor::channelCount(local_448);
  pIVar6 = ImageInput::spec((ImageInput *)0x337669);
  local_2fc.uint128_value._12_4_ = ImageSpec::height(pIVar6);
  pIVar6 = ImageInput::spec((ImageInput *)0x337685);
  local_2fc.uint128_value._8_4_ = ImageSpec::width(pIVar6);
  local_2fc.ulong_long_value._4_4_ =
       FormatDescriptor::largestChannelBitLength(in_stack_fffffffffffffb60);
  local_300 = imageio::bit_ceil<unsigned_int>(local_2fc.ulong_long_value._4_4_);
  local_304 = 8;
  pvVar14 = (v10 *)&local_304;
  puVar7 = std::max<unsigned_int>(&local_300,(uint *)pvVar14);
  local_2fc.uint_value = *puVar7;
  if ((local_2fc.int_value != 8) && (local_2fc.int_value != 0x10)) {
    local_345 = 1;
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_210 = local_338;
    local_218 = "PNG decode error: Requested decode into {}-bit format is not supported.";
    local_e0 = "PNG decode error: Requested decode into {}-bit format is not supported.";
    local_338[0] = "PNG decode error: Requested decode into {}-bit format is not supported.";
    local_d8 = local_210;
    sStack_228 = std::char_traits<char>::length((char_type *)0x337782);
    local_68 = local_218;
    local_220 = local_328;
    local_230 = local_338[0];
    local_80 = &local_230;
    local_78 = local_338[0];
    sStack_70 = sStack_228;
    pfVar9 = ::fmt::v10::
             make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int_const>
                       ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
                         *)&local_2fc.string,pvVar14,(uint *)local_220);
    local_128 = &stack0xfffffffffffffda8;
    local_130 = &stack0xfffffffffffffd98;
    local_110 = 2;
    uVar16 = 2;
    args.field_1.values_ = extraout_RDX.values_;
    args.desc_ = (unsigned_long_long)pfVar9;
    local_120 = local_130;
    local_118 = local_130;
    local_108 = local_128;
    ::fmt::v10::vformat_abi_cxx11_(in_stack_fffffffffffffda8,args);
    std::runtime_error::runtime_error(prVar8,local_328);
    local_345 = 0;
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar10 = std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::
            operator[](&local_2e8->samples,0);
  local_346 = (*(ulong *)pvVar10 >> 0x1c & 1) != 0;
  pvVar10 = std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::
            operator[](&local_2e8->samples,0);
  local_347 = (*(ulong *)pvVar10 >> 0x1d & 1) != 0;
  pvVar10 = std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::
            operator[](&local_2e8->samples,0);
  local_348 = (*(ulong *)pvVar10 >> 0x1e & 1) != 0;
  pvVar10 = std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::
            operator[](&local_2e8->samples,0);
  local_349 = (*(ulong *)pvVar10 >> 0x1f & 1) != 0;
  if (((((local_347 & 1) == 0) && ((local_346 & 1) == 0)) && ((local_348 & 1) == 0)) &&
     (!(bool)local_349)) {
    *(int *)(in_RDI + 0x394) = local_2fc.int_value;
    local_3b0 = local_2e8;
    LVar3 = readImage::anon_class_8_1_e9de82e6::operator()(in_stack_fffffffffffffba0);
    *(LodePNGColorType *)(in_RDI + 0x390) = LVar3;
    __n = *(size_type *)(in_RDI + 0x570);
    pvVar14 = local_2d0;
    local_3b4 = lodepng_finish_decode
                          (in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60,
                           (uint)((ulong)in_stack_fffffffffffffb58 >> 0x20),
                           (uint)in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                           in_stack_fffffffffffffb48,in_stack_fffffffffffffb80);
    lVar1 = local_2c8;
    if (local_3b4 == 0) {
      local_3b4 = 0;
      if (local_2fc.int_value == 0x10) {
        for (local_408 = (v10 *)0x0; local_408 < local_2d0; local_408 = local_408 + 2) {
          std::swap<unsigned_char>((uchar *)(local_408 + lVar1),(uchar *)(local_408 + lVar1 + 1));
        }
      }
      if (*(int *)(in_RDI + 0x518) != 0) {
        for (local_41c = 0; local_41c < local_2fc._12_4_; local_41c = local_41c + 1) {
          for (local_420 = 0; local_420 < local_2fc._8_4_; local_420 = local_420 + 1) {
            for (local_424 = 0; local_424 < local_2ec; local_424 = local_424 + 1) {
              uVar4 = local_41c * local_2fc.int128_value._8_4_ * local_2ec + local_420 * local_2ec +
                      local_424;
              if (local_2fc.int_value == 8) {
                puVar12 = (undefined1 *)(local_2c8 + (ulong)uVar4);
                std::array<unsigned_int,_4UL>::operator[](in_stack_fffffffffffffb30,__n);
                std::array<unsigned_int,_4UL>::operator[](in_stack_fffffffffffffb30,__n);
                uVar5 = imageio::convertUNORM
                                  ((uint32_t)in_stack_fffffffffffffb50,
                                   (uint32_t)((ulong)in_stack_fffffffffffffb48 >> 0x20),
                                   (uint32_t)in_stack_fffffffffffffb48);
                *puVar12 = (char)uVar5;
              }
              else {
                puVar13 = (undefined2 *)(local_2c8 + (ulong)uVar4 * 2);
                std::array<unsigned_int,_4UL>::operator[](in_stack_fffffffffffffb30,__n);
                std::array<unsigned_int,_4UL>::operator[](in_stack_fffffffffffffb30,__n);
                uVar5 = imageio::convertUNORM
                                  ((uint32_t)in_stack_fffffffffffffb50,
                                   (uint32_t)((ulong)in_stack_fffffffffffffb48 >> 0x20),
                                   (uint32_t)in_stack_fffffffffffffb48);
                *puVar13 = (short)uVar5;
              }
            }
          }
        }
      }
      return;
    }
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_138 = &local_3e8;
    local_140 = "PNG decode error: {}.";
    local_100 = "PNG decode error: {}.";
    local_3e8 = "PNG decode error: {}.";
    psVar15 = &local_3e0;
    local_f8 = local_138;
    sVar11 = std::char_traits<char>::length((char_type *)0x337ef1);
    *psVar15 = sVar11;
    local_8 = local_140;
    local_3f0 = (undefined1  [8])lodepng_error_text(local_3b4);
    local_270 = local_3d8;
    local_280 = local_3e8;
    sStack_278 = local_3e0;
    local_288 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
                 *)local_3f0;
    local_d0 = &local_280;
    local_298 = local_3e8;
    local_c8 = local_298;
    local_2b8[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const*>
                             (local_288,pvVar14,(char **)local_270);
    local_a8 = &local_2a8;
    local_b0 = local_2b8;
    local_90 = 0xc;
    local_2a8 = 0xc;
    args_01.field_1.values_ = in_stack_fffffffffffffda0.values_;
    args_01.desc_ = in_stack_fffffffffffffd98;
    local_a0 = local_b0;
    local_98 = local_b0;
    local_88 = local_a8;
    local_2a0 = local_b0;
    ::fmt::v10::vformat_abi_cxx11_(in_stack_fffffffffffffda8,args_01);
    std::runtime_error::runtime_error(prVar8,local_3d8);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_3a1 = 1;
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_148 = &local_380;
  local_150 = "PNG decode error: Requested format conversion to {}-bit{}{}{}{} is not supported.";
  local_f0 = "PNG decode error: Requested format conversion to {}-bit{}{}{}{} is not supported.";
  local_380 = "PNG decode error: Requested format conversion to {}-bit{}{}{}{} is not supported.";
  psVar15 = &local_378;
  local_e8 = local_148;
  sVar11 = std::char_traits<char>::length((char_type *)0x337b03);
  *psVar15 = sVar11;
  local_10 = local_150;
  local_3a0 = "";
  local_388 = "";
  if ((local_346 & 1) != 0) {
    local_388 = " Linear";
  }
  local_390 = "";
  if ((local_347 & 1) != 0) {
    local_390 = " Exponent";
  }
  local_398 = "";
  if ((local_348 & 1) != 0) {
    local_398 = " Signed";
  }
  if ((local_349 & 1) != 0) {
    local_3a0 = " Float";
  }
  local_158 = local_370;
  local_168 = local_380;
  sStack_160 = local_378;
  local_170 = &local_2fc;
  local_178 = &local_388;
  local_180 = &local_390;
  local_188 = &local_398;
  local_190 = &local_3a0;
  local_60 = &local_168;
  local_1a0 = local_380;
  local_58 = local_1a0;
  ::fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int_const,char_const*,char_const*,char_const*,char_const*>
            (&local_208,(v10 *)&local_170->string,(uint *)local_178,local_180,local_188,local_190,
             in_stack_fffffffffffffb28);
  local_38 = &local_1b0;
  local_40 = &local_208;
  local_28 = 0xcccc2;
  local_1b0 = 0xcccc2;
  args_00.field_1.values_ = in_stack_fffffffffffffda0.values_;
  args_00.desc_ = in_stack_fffffffffffffd98;
  local_30 = local_40;
  local_20 = local_38;
  local_18 = local_40;
  local_1a8 = local_40;
  ::fmt::v10::vformat_abi_cxx11_(in_stack_fffffffffffffda8,args_00);
  std::runtime_error::runtime_error(prVar8,local_370);
  local_3a1 = 0;
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
PngInput::readImage(void* bufferOut, size_t bufferOutByteCount,
                    uint32_t /*subimage*/, uint32_t /*miplevel*/,
                    const FormatDescriptor& format)
{
    const auto& targetFormat = format.isUnknown() ? spec().format() : format;

    const auto channelCount = targetFormat.channelCount();
    const auto height = spec().height();
    const auto width = spec().width();
    const auto targetBitLength = targetFormat.largestChannelBitLength();
    const auto requestBits = std::max(imageio::bit_ceil(targetBitLength), 8u);

    if (requestBits != 8 && requestBits != 16)
        throw std::runtime_error(fmt::format(
                "PNG decode error: Requested decode into {}-bit format is not supported.",
                requestBits)
              );

    const bool targetL = targetFormat.samples[0].qualifierLinear;
    const bool targetE = targetFormat.samples[0].qualifierExponent;
    const bool targetS = targetFormat.samples[0].qualifierSigned;
    const bool targetF = targetFormat.samples[0].qualifierFloat;

    // Only UNORM requests are allowed for PNG inputs
    if (targetE || targetL || targetS || targetF)
        throw std::runtime_error(fmt::format(
                "PNG decode error: Requested format conversion to {}-bit{}{}{}{} is not supported.",
                requestBits,
                targetL ? " Linear" : "",
                targetE ? " Exponent" : "",
                targetS ? " Signed" : "",
                targetF ? " Float" : "")
              );

    state.info_raw.bitdepth = requestBits;
    state.info_raw.colortype = [&]{
        switch (targetFormat.channelCount()) {
        case 1:
            return LCT_GREY;
        case 2:
            return LCT_GREY_ALPHA;
        case 3:
            return LCT_RGB;
        case 4:
            return LCT_RGBA;
        }
        throw std::runtime_error(fmt::format(
                "PNG decode error: Requested decode into {} channels is not supported.",
                targetFormat.channelCount())
              );
    }();
    auto lodepngError = lodepng_finish_decode(
                                          (unsigned char*)bufferOut,
                                          bufferOutByteCount,
                                          width,
                                          height,
                                          &state,
                                          pIdat,
                                          idatsize);

    if (lodepngError)
        throw std::runtime_error(fmt::format(
                "PNG decode error: {}.", lodepng_error_text(lodepngError)));

    // TODO: Detect endianness
    // if constexpr (std::endian::native == std::endian::little)
    if (requestBits == 16) {
        // LodePNG loads 16 bit channels in big endian order
        auto* data = (unsigned char*) bufferOut;
        for (size_t i = 0; i < bufferOutByteCount; i += 2)
            std::swap(*(data + i), *(data + i + 1));
    }

    if (state.info_png.sbit_defined) {
        // Recalculate the UNORM values based on sBit information to ensure best loading/rounding
        // result regardless of what the png file's writer saved
        std::array<uint32_t, 4> sBits{
            state.info_png.sbit_r,
            state.info_png.sbit_g,
            state.info_png.sbit_b,
            state.info_png.sbit_a,
        };

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < channelCount; ++c) {
                    const auto index = y * width * channelCount + x * channelCount + c;
                    if (requestBits == 8) {
                        auto& value = *(reinterpret_cast<uint8_t*>(bufferOut) + index);
                        value = static_cast<uint8_t>(imageio::convertUNORM(value >> (8 - sBits[c]), sBits[c], 8));
                    } else { // requestBits == 16
                        auto& value = *(reinterpret_cast<uint16_t*>(bufferOut) + index);
                        value = static_cast<uint16_t>(imageio::convertUNORM(value >> (16 - sBits[c]), sBits[c], 16));
                    }
                }
            }
        }
    }
}